

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

string * google::protobuf::compiler::CanonicalizePath(string *__return_storage_ptr__,string *path)

{
  bool bVar1;
  size_type sVar2;
  char *delim;
  int i;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  canonical_parts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  parts;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  canonical_parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  canonical_parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  canonical_parts.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  delim = (char *)0x1;
  Split(&parts,path,"/",true);
  lVar4 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&((parts.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar4),".");
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&canonical_parts,
                  (value_type *)
                  ((long)&((parts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4));
    }
    lVar4 = lVar4 + 0x20;
  }
  Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            (__return_storage_ptr__,(protobuf *)&canonical_parts,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x34efbe,delim);
  sVar2 = path->_M_string_length;
  if (sVar2 != 0) {
    if (*(path->_M_dataplus)._M_p == '/') {
      std::operator+(&local_50,'/',__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      sVar2 = path->_M_string_length;
      if (sVar2 == 0) goto LAB_002d3ca6;
    }
    if ((((path->_M_dataplus)._M_p[sVar2 - 1] == '/') &&
        (__return_storage_ptr__->_M_string_length != 0)) &&
       ((__return_storage_ptr__->_M_dataplus)._M_p[__return_storage_ptr__->_M_string_length - 1] !=
        '/')) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
LAB_002d3ca6:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&parts);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&canonical_parts);
  return __return_storage_ptr__;
}

Assistant:

static string CanonicalizePath(string path) {
#ifdef _WIN32
  // The Win32 API accepts forward slashes as a path delimiter even though
  // backslashes are standard.  Let's avoid confusion and use only forward
  // slashes.
  if (HasPrefixString(path, "\\\\")) {
    // Avoid converting two leading backslashes.
    path = "\\\\" + StringReplace(path.substr(2), "\\", "/", true);
  } else {
    path = StringReplace(path, "\\", "/", true);
  }
#endif

  std::vector<string> canonical_parts;
  std::vector<string> parts = Split(
      path, "/", true);  // Note:  Removes empty parts.
  for (int i = 0; i < parts.size(); i++) {
    if (parts[i] == ".") {
      // Ignore.
    } else {
      canonical_parts.push_back(parts[i]);
    }
  }
  string result = Join(canonical_parts, "/");
  if (!path.empty() && path[0] == '/') {
    // Restore leading slash.
    result = '/' + result;
  }
  if (!path.empty() && LastChar(path) == '/' &&
      !result.empty() && LastChar(result) != '/') {
    // Restore trailing slash.
    result += '/';
  }
  return result;
}